

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_copy(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_context *pCtx_00;
  int iVar1;
  char *pcVar2;
  jx9_value *local_20b0;
  jx9_value *local_2088;
  int local_2064;
  jx9_int64 jStack_2060;
  int nLen;
  jx9_int64 n;
  void *pOut;
  void *pIn;
  char zBuf [8192];
  char *local_40;
  char *zFile;
  jx9_io_stream *pSout;
  jx9_io_stream *pSin;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  pSin = (jx9_io_stream *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if (((nArg < 2) || (iVar1 = jx9_value_is_string(*apArg), iVar1 == 0)) ||
     (iVar1 = jx9_value_is_string(*(jx9_value **)&pSin->iVersion), iVar1 == 0)) {
    jx9_context_throw_error(pjStack_18,2,"Expecting a source and a destination path");
    jx9_result_bool(pjStack_18,0);
  }
  else {
    local_40 = jx9_value_to_string((jx9_value *)pSin->zName,&local_2064);
    pSout = jx9VmGetStreamDevice(pjStack_18->pVm,&local_40,local_2064);
    if (pSout == (jx9_io_stream *)0x0) {
      jx9_context_throw_error(pjStack_18,2,"No such stream device, JX9 is returning FALSE");
      jx9_result_bool(pjStack_18,0);
    }
    else {
      if (apArg_local._4_4_ < 3) {
        local_2088 = (jx9_value *)0x0;
      }
      else {
        local_2088 = (jx9_value *)pSin->xOpen;
      }
      pOut = jx9StreamOpenHandle(pjStack_18->pVm,pSout,local_40,1,0,local_2088,0,(int *)0x0);
      if (pOut == (void *)0x0) {
        jx9_context_throw_error_format
                  (pjStack_18,1,"IO error while opening source: \'%s\'",local_40);
        jx9_result_bool(pjStack_18,0);
      }
      else {
        local_40 = jx9_value_to_string(*(jx9_value **)&pSin->iVersion,&local_2064);
        zFile = (char *)jx9VmGetStreamDevice(pjStack_18->pVm,&local_40,local_2064);
        pCtx_00 = pjStack_18;
        if ((jx9_io_stream *)zFile == (jx9_io_stream *)0x0) {
          jx9_context_throw_error(pjStack_18,2,"No such stream device, JX9 is returning FALSE");
          jx9_result_bool(pjStack_18,0);
          jx9StreamCloseHandle(pSout,pOut);
        }
        else if (((jx9_io_stream *)zFile)->xWrite ==
                 (_func_jx9_int64_void_ptr_void_ptr_jx9_int64 *)0x0) {
          pcVar2 = jx9_function_name(pjStack_18);
          jx9_context_throw_error_format
                    (pCtx_00,2,
                     "IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE"
                     ,pcVar2,pSout->zName);
          jx9_result_bool(pjStack_18,0);
          jx9StreamCloseHandle(pSout,pOut);
        }
        else {
          if (apArg_local._4_4_ < 3) {
            local_20b0 = (jx9_value *)0x0;
          }
          else {
            local_20b0 = (jx9_value *)pSin->xOpen;
          }
          n = (jx9_int64)
              jx9StreamOpenHandle(pjStack_18->pVm,(jx9_io_stream *)zFile,local_40,0x1c,0,local_20b0,
                                  0,(int *)0x0);
          if ((void *)n == (void *)0x0) {
            jx9_context_throw_error_format
                      (pjStack_18,1,"IO error while opening destination: \'%s\'",local_40);
            jx9_result_bool(pjStack_18,0);
            jx9StreamCloseHandle(pSout,pOut);
          }
          else {
            do {
              jStack_2060 = (*pSout->xRead)(pOut,&pIn,0x2000);
              if (jStack_2060 < 1) break;
              jStack_2060 = (**(code **)(zFile + 0x40))(n,&pIn,jStack_2060);
            } while (0 < jStack_2060);
            jx9StreamCloseHandle(pSout,pOut);
            jx9StreamCloseHandle((jx9_io_stream *)zFile,(void *)n);
            jx9_result_bool(pjStack_18,1);
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_copy(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pSin, *pSout;	
	const char *zFile;
	char zBuf[8192];
	void *pIn, *pOut;
	jx9_int64 n;
	int nLen;
	if( nArg < 2 || !jx9_value_is_string(apArg[0]) || !jx9_value_is_string(apArg[1])){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting a source and a destination path");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the source name */
	zFile = jx9_value_to_string(apArg[0], &nLen);
	/* Point to the target IO stream device */
	pSin = jx9VmGetStreamDevice(pCtx->pVm, &zFile, nLen);
	if( pSin == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "No such stream device, JX9 is returning FALSE");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Try to open the source file in a read-only mode */
	pIn = jx9StreamOpenHandle(pCtx->pVm, pSin, zFile, JX9_IO_OPEN_RDONLY, FALSE, nArg > 2 ? apArg[2] : 0, FALSE, 0);
	if( pIn == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_ERR, "IO error while opening source: '%s'", zFile);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the destination name */
	zFile = jx9_value_to_string(apArg[1], &nLen);
	/* Point to the target IO stream device */
	pSout = jx9VmGetStreamDevice(pCtx->pVm, &zFile, nLen);
	if( pSout == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "No such stream device, JX9 is returning FALSE");
		jx9_result_bool(pCtx, 0);
		jx9StreamCloseHandle(pSin, pIn);
		return JX9_OK;
	}
	if( pSout->xWrite == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE", 
			jx9_function_name(pCtx), pSin->zName
			);
		jx9_result_bool(pCtx, 0);
		jx9StreamCloseHandle(pSin, pIn);
		return JX9_OK;
	}
	/* Try to open the destination file in a read-write mode */
	pOut = jx9StreamOpenHandle(pCtx->pVm, pSout, zFile, 
		JX9_IO_OPEN_CREATE|JX9_IO_OPEN_TRUNC|JX9_IO_OPEN_RDWR, FALSE, nArg > 2 ? apArg[2] : 0, FALSE, 0);
	if( pOut == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_ERR, "IO error while opening destination: '%s'", zFile);
		jx9_result_bool(pCtx, 0);
		jx9StreamCloseHandle(pSin, pIn);
		return JX9_OK;
	}
	/* Perform the requested operation */
	for(;;){
		/* Read from source */
		n = pSin->xRead(pIn, zBuf, sizeof(zBuf));
		if( n < 1 ){
			/* EOF or IO error, break immediately */
			break;
		}
		/* Write to dest */
		n = pSout->xWrite(pOut, zBuf, n);
		if( n < 1 ){
			/* IO error, break immediately */
			break;
		}
	}
	/* Close the streams */
	jx9StreamCloseHandle(pSin, pIn);
	jx9StreamCloseHandle(pSout, pOut);
	/* Return TRUE */
	jx9_result_bool(pCtx, 1);
	return JX9_OK;
}